

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * __thiscall
duckdb::Value::DefaultCastAs
          (Value *__return_storage_ptr__,Value *this,LogicalType *target_type,bool strict)

{
  CastFunctionSet set;
  GetCastFunctionInput get_input;
  CastFunctionSet local_60;
  GetCastFunctionInput local_38;
  
  CastFunctionSet::CastFunctionSet(&local_60);
  local_38.context.ptr = (ClientContext *)0x0;
  local_38.query_location.index = 0xffffffffffffffff;
  CastAs(__return_storage_ptr__,this,&local_60,&local_38,target_type,strict);
  ::std::vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>::~vector
            (&local_60.bind_functions.
              super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>);
  return __return_storage_ptr__;
}

Assistant:

Value Value::DefaultCastAs(const LogicalType &target_type, bool strict) const {
	CastFunctionSet set;
	GetCastFunctionInput get_input;
	return CastAs(set, get_input, target_type, strict);
}